

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any cs_impl::any::
    make<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
              (void)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  proxy *in_RDI;
  
  if ((DAT_002595e8 == 0) || (cs::global_thread_counter != 0)) {
    puVar1 = (undefined8 *)operator_new(0x38);
  }
  else {
    puVar1 = *(undefined8 **)
              (&holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                ::allocator + DAT_002595e8 * 8);
    DAT_002595e8 = DAT_002595e8 + -1;
  }
  *puVar1 = &PTR__holder_0024df00;
  puVar1[1] = phmap::priv::EmptyGroup()::empty_group;
  puVar1[6] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  if ((DAT_00258550 == 0) || (cs::global_thread_counter != 0)) {
    puVar2 = (undefined1 *)operator_new(0x18);
  }
  else {
    puVar2 = (undefined1 *)(&cs::null_pointer)[DAT_00258550];
    DAT_00258550 = DAT_00258550 + -1;
  }
  *puVar2 = 0;
  *(undefined2 *)(puVar2 + 2) = 0;
  *(undefined8 *)(puVar2 + 8) = 1;
  *(undefined8 **)(puVar2 + 0x10) = puVar1;
  *(undefined1 **)in_RDI = puVar2;
  return (any)in_RDI;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}